

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::SetTriHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  ErrorCode EVar1;
  Error *pEVar2;
  BbrDataset bbrDataset;
  BbrDataset local_a8;
  undefined1 local_40 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_a8.mTriHostname._M_dataplus._M_p = (pointer)&local_a8.mTriHostname.field_2;
  local_a8.mTriHostname._M_string_length = 0;
  local_a8.mTriHostname.field_2._M_local_buf[0] = '\0';
  local_a8.mRegistrarHostname._M_dataplus._M_p = (pointer)&local_a8.mRegistrarHostname.field_2;
  local_a8.mRegistrarHostname._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_a8.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  local_a8.mRegistrarIpv6Addr._M_dataplus._M_p = (pointer)&local_a8.mRegistrarIpv6Addr.field_2;
  local_a8.mRegistrarIpv6Addr._M_string_length = 0;
  local_a8.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  local_a8.mPresentFlags = 0;
  std::__cxx11::string::_M_assign((string *)&local_a8);
  local_a8.mPresentFlags = local_a8.mPresentFlags | 0x8000;
  (*((this->mCommissioner).
     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Commissioner[0x16])(local_40);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_40);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if (EVar1 == kNone) {
    MergeDataset(&this->mBbrDataset,&local_a8);
  }
  BbrDataset::~BbrDataset(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetTriHostname(const std::string &aHostname)
{
    Error      error;
    BbrDataset bbrDataset;

    bbrDataset.mTriHostname = aHostname;
    bbrDataset.mPresentFlags |= BbrDataset::kTriHostnameBit;

    SuccessOrExit(error = mCommissioner->SetBbrDataset(bbrDataset));

    MergeDataset(mBbrDataset, bbrDataset);

exit:
    return error;
}